

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O3

void * QRunnable::QGenericRunnable::
       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4058:5)>
       ::impl(Op op,HelperBase *that,void *arg)

{
  OpFn p_Var1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  if (op == Destroy) {
    operator_delete(that,0x20);
  }
  else if (op == Run) {
    iVar3 = *(int *)((long)&that[1].fn + 4);
    if (0 < iVar3) {
      p_Var1 = that[2].fn;
      uVar4 = (long)*(int *)&that[1].fn << 4 | 0xc;
      do {
        lVar2 = *(long *)(p_Var1 + 8);
        (**(code **)(p_Var1 + 0x10))
                  ((long)*(int *)(lVar2 + -4 + uVar4) * *(long *)(**(long **)p_Var1 + 0x28) +
                   *(long *)(**(long **)p_Var1 + 0x38) + (long)*(int *)(lVar2 + -0xc + uVar4) * 4,
                   *(undefined4 *)(lVar2 + -8 + uVar4),*(undefined4 *)(p_Var1 + 0x18),
                   *(undefined1 *)(lVar2 + uVar4));
        uVar4 = uVar4 + 0x10;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    QSemaphore::release((int)that[3].fn);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }